

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O3

pool_ptr<soul::AST::ProcessorInstance> __thiscall
soul::AST::Graph::findChildProcessor<soul::Identifier>
          (Graph *this,Identifier *processorInstanceName)

{
  string *psVar1;
  long *in_RDX;
  _func_int **pp_Var2;
  
  psVar1 = processorInstanceName[0x26].name;
  if (psVar1 != processorInstanceName[0x27].name) {
    do {
      pp_Var2 = (_func_int **)(psVar1->_M_dataplus)._M_p;
      if (pp_Var2[5] == (_func_int *)0x0) {
        throwInternalCompilerError("object != nullptr","operator->",0x3c);
      }
      if (*(long *)(pp_Var2[5] + 0x30) == *in_RDX) goto LAB_001e7638;
      psVar1 = (string *)&psVar1->_M_string_length;
    } while (psVar1 != processorInstanceName[0x27].name);
  }
  pp_Var2 = (_func_int **)0x0;
LAB_001e7638:
  (this->super_ProcessorBase).super_ModuleBase.super_ASTObject._vptr_ASTObject = pp_Var2;
  return (pool_ptr<soul::AST::ProcessorInstance>)(ProcessorInstance *)this;
}

Assistant:

pool_ptr<ProcessorInstance> findChildProcessor (const StringType& processorInstanceName) const
        {
            for (auto& i : processorInstances)
                if (i->instanceName->identifier == processorInstanceName)
                    return i;

            return {};
        }